

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O3

void R_SetupFreelook(void)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [16];
  double dVar7;
  float *pfVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar31;
  undefined1 auVar24 [16];
  int iVar32;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  
  dVar7 = FocalLengthY;
  if (camera == (AActor *)0x0) {
    dVar1 = 0.0;
  }
  else {
    dVar1 = c_tan(ViewPitch.Degrees * -0.017453292519943295);
    dVar1 = dVar1 * dVar7;
  }
  auVar6 = _DAT_0073b300;
  uVar12 = (ulong)(uint)viewheight;
  CenterY = (double)viewheight * 0.5 + dVar1;
  uVar9 = SUB84(CenterY + 6755399441055744.0,0);
  globaluclip = -CenterY * (1.0 / InvZtoScale);
  globaldclip = ((double)viewheight - CenterY) * (1.0 / InvZtoScale);
  fVar14 = (float)FocalLengthY;
  fVar18 = (float)CenterY;
  centery = uVar9;
  if ((int)uVar9 < 1) {
    uVar12 = 1;
    if (1 < viewheight) {
      uVar12 = (ulong)(uint)viewheight;
    }
    fVar18 = 0.5 - fVar18;
    lVar10 = uVar12 - 1;
    fVar15 = fVar18 + 0.0;
    fVar16 = fVar18 + 1.0;
    fVar17 = fVar18 + 2.0;
    fVar18 = fVar18 + 3.0;
    auVar23._8_4_ = (int)lVar10;
    auVar23._0_8_ = lVar10;
    auVar23._12_4_ = (int)((ulong)lVar10 >> 0x20);
    lVar10 = 0;
    auVar23 = auVar23 ^ _DAT_0073b300;
    auVar29 = _DAT_0073c1a0;
    auVar40 = _DAT_0073b2f0;
    do {
      auVar27 = auVar40 ^ auVar6;
      iVar31 = auVar23._4_4_;
      iVar32 = auVar23._12_4_;
      auVar37._4_4_ = fVar16;
      auVar37._0_4_ = fVar15;
      auVar37._8_4_ = fVar17;
      auVar37._12_4_ = fVar18;
      auVar37 = rcpps(in_XMM11,auVar37);
      fVar42 = fVar14 * auVar37._0_4_;
      fVar45 = fVar14 * auVar37._4_4_;
      fVar46 = fVar14 * auVar37._8_4_;
      fVar47 = fVar14 * auVar37._12_4_;
      auVar28._0_4_ = (fVar14 - fVar15 * fVar42) * auVar37._0_4_ + fVar42;
      auVar28._4_4_ = (fVar14 - fVar16 * fVar45) * auVar37._4_4_ + fVar45;
      auVar28._8_4_ = (fVar14 - fVar17 * fVar46) * auVar37._8_4_ + fVar46;
      auVar28._12_4_ = (fVar14 - fVar18 * fVar47) * auVar37._12_4_ + fVar47;
      if ((bool)(~(auVar27._4_4_ == iVar31 && auVar23._0_4_ < auVar27._0_4_ ||
                  iVar31 < auVar27._4_4_) & 1)) {
        *(float *)((long)yslope + lVar10) = auVar28._0_4_;
      }
      if ((auVar27._12_4_ != iVar32 || auVar27._8_4_ <= auVar23._8_4_) && auVar27._12_4_ <= iVar32)
      {
        *(float *)((long)yslope + lVar10 + 4) = auVar28._4_4_;
      }
      auVar37 = auVar29 ^ auVar6;
      in_XMM11._0_4_ = -(uint)(auVar23._0_4_ < auVar37._0_4_);
      in_XMM11._4_4_ = -(uint)(iVar31 < auVar37._4_4_);
      in_XMM11._8_4_ = -(uint)(auVar23._8_4_ < auVar37._8_4_);
      in_XMM11._12_4_ = -(uint)(iVar32 < auVar37._12_4_);
      iVar31 = -(uint)(auVar37._4_4_ == iVar31);
      iVar32 = -(uint)(auVar37._12_4_ == iVar32);
      auVar43._4_4_ = iVar31;
      auVar43._0_4_ = iVar31;
      auVar43._8_4_ = iVar32;
      auVar43._12_4_ = iVar32;
      auVar34._4_4_ = in_XMM11._4_4_;
      auVar34._0_4_ = in_XMM11._4_4_;
      auVar34._8_4_ = in_XMM11._12_4_;
      auVar34._12_4_ = in_XMM11._12_4_;
      auVar27._8_4_ = 0xffffffff;
      auVar27._0_8_ = 0xffffffffffffffff;
      auVar27._12_4_ = 0xffffffff;
      auVar27 = (auVar34 | auVar43 & in_XMM11) ^ auVar27;
      if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        auVar4._4_8_ = in_XMM11._8_8_;
        auVar4._0_4_ = auVar28._4_4_;
        auVar39._0_8_ = auVar4._0_8_ << 0x20;
        auVar39._8_4_ = auVar28._8_4_;
        auVar39._12_4_ = auVar28._12_4_;
        in_XMM11._8_8_ = auVar28._8_8_;
        in_XMM11._0_8_ = auVar39._8_8_;
        *(float *)((long)yslope + lVar10 + 8) = auVar28._8_4_;
      }
      if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(float *)((long)yslope + lVar10 + 0xc) = auVar28._12_4_;
      }
      lVar11 = auVar40._8_8_;
      auVar40._0_8_ = auVar40._0_8_ + 4;
      auVar40._8_8_ = lVar11 + 4;
      lVar11 = auVar29._8_8_;
      auVar29._0_8_ = auVar29._0_8_ + 4;
      auVar29._8_8_ = lVar11 + 4;
      fVar15 = fVar15 + 4.0;
      fVar16 = fVar16 + 4.0;
      fVar17 = fVar17 + 4.0;
      fVar18 = fVar18 + 4.0;
      lVar10 = lVar10 + 0x10;
    } while ((ulong)((int)uVar12 + 3U & 0xfffffffc) << 2 != lVar10);
  }
  else {
    fVar15 = fVar18 + -0.5;
    if ((int)uVar9 < viewheight) {
      pfVar8 = yslope + 3;
      uVar13 = (ulong)(uVar9 & 0x7fffffff);
      do {
        pfVar8[-3] = fVar14 / fVar15;
        auVar40 = _DAT_0073c1a0;
        auVar29 = _DAT_0073b300;
        auVar6 = _DAT_0073b2f0;
        fVar15 = fVar15 + -1.0;
        pfVar8 = pfVar8 + 1;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
      lVar10 = uVar12 - (uVar9 & 0x7fffffff);
      fVar18 = (float)(int)uVar9 + (0.5 - fVar18);
      lVar11 = lVar10 + -1;
      fVar15 = fVar18 + 0.0;
      fVar16 = fVar18 + 1.0;
      fVar17 = fVar18 + 2.0;
      fVar18 = fVar18 + 3.0;
      auVar19._8_4_ = (int)lVar11;
      auVar19._0_8_ = lVar11;
      auVar19._12_4_ = (int)((ulong)lVar11 >> 0x20);
      uVar12 = 0;
      auVar19 = auVar19 ^ _DAT_0073b300;
      do {
        auVar24._8_4_ = (int)uVar12;
        auVar24._0_8_ = uVar12;
        auVar24._12_4_ = (int)(uVar12 >> 0x20);
        auVar23 = (auVar24 | auVar6) ^ auVar29;
        iVar31 = auVar19._4_4_;
        iVar32 = auVar19._12_4_;
        auVar2._4_4_ = fVar16;
        auVar2._0_4_ = fVar15;
        auVar2._8_4_ = fVar17;
        auVar2._12_4_ = fVar18;
        auVar37 = rcpps(in_XMM11,auVar2);
        fVar42 = fVar14 * auVar37._0_4_;
        fVar45 = fVar14 * auVar37._4_4_;
        fVar46 = fVar14 * auVar37._8_4_;
        fVar47 = fVar14 * auVar37._12_4_;
        if ((bool)(~(auVar23._4_4_ == iVar31 && auVar19._0_4_ < auVar23._0_4_ ||
                    iVar31 < auVar23._4_4_) & 1)) {
          pfVar8[-3] = (fVar14 - fVar15 * fVar42) * auVar37._0_4_ + fVar42;
        }
        if ((auVar23._12_4_ != iVar32 || auVar23._8_4_ <= auVar19._8_4_) && auVar23._12_4_ <= iVar32
           ) {
          pfVar8[-2] = (fVar14 - fVar16 * fVar45) * auVar37._4_4_ + fVar45;
        }
        auVar23 = (auVar24 | auVar40) ^ auVar29;
        auVar33._0_4_ = -(uint)(auVar19._0_4_ < auVar23._0_4_);
        auVar33._4_4_ = -(uint)(iVar31 < auVar23._4_4_);
        auVar33._8_4_ = -(uint)(auVar19._8_4_ < auVar23._8_4_);
        auVar33._12_4_ = -(uint)(iVar32 < auVar23._12_4_);
        iVar31 = -(uint)(auVar23._4_4_ == iVar31);
        iVar32 = -(uint)(auVar23._12_4_ == iVar32);
        auVar38._4_4_ = iVar31;
        auVar38._0_4_ = iVar31;
        auVar38._8_4_ = iVar32;
        auVar38._12_4_ = iVar32;
        in_XMM11 = auVar38 & auVar33;
        auVar25._4_4_ = auVar33._4_4_;
        auVar25._0_4_ = auVar33._4_4_;
        auVar25._8_4_ = auVar33._12_4_;
        auVar25._12_4_ = auVar33._12_4_;
        auVar26._8_4_ = 0xffffffff;
        auVar26._0_8_ = 0xffffffffffffffff;
        auVar26._12_4_ = 0xffffffff;
        auVar26 = (auVar25 | in_XMM11) ^ auVar26;
        if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pfVar8[-1] = (fVar14 - fVar17 * fVar46) * auVar37._8_4_ + fVar46;
        }
        if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *pfVar8 = (fVar14 - fVar18 * fVar47) * auVar37._12_4_ + fVar47;
        }
        uVar12 = uVar12 + 4;
        fVar15 = fVar15 + 4.0;
        fVar16 = fVar16 + 4.0;
        fVar17 = fVar17 + 4.0;
        fVar18 = fVar18 + 4.0;
        pfVar8 = pfVar8 + 4;
      } while ((lVar10 + 3U & 0xfffffffffffffffc) != uVar12);
    }
    else {
      uVar12 = 1;
      if (1 < viewheight) {
        uVar12 = (ulong)(uint)viewheight;
      }
      lVar10 = uVar12 - 1;
      fVar18 = fVar15 + -0.0;
      fVar16 = fVar15 + -1.0;
      fVar17 = fVar15 + -2.0;
      fVar15 = fVar15 + -3.0;
      auVar20._8_4_ = (int)lVar10;
      auVar20._0_8_ = lVar10;
      auVar20._12_4_ = (int)((ulong)lVar10 >> 0x20);
      lVar10 = 0;
      auVar20 = auVar20 ^ _DAT_0073b300;
      auVar21 = _DAT_0073c1a0;
      auVar22 = _DAT_0073b2f0;
      do {
        auVar29 = auVar22 ^ auVar6;
        iVar31 = auVar20._4_4_;
        iVar32 = auVar20._12_4_;
        auVar3._4_4_ = fVar16;
        auVar3._0_4_ = fVar18;
        auVar3._8_4_ = fVar17;
        auVar3._12_4_ = fVar15;
        auVar40 = rcpps(in_XMM11,auVar3);
        fVar42 = fVar14 * auVar40._0_4_;
        fVar45 = fVar14 * auVar40._4_4_;
        fVar46 = fVar14 * auVar40._8_4_;
        fVar47 = fVar14 * auVar40._12_4_;
        auVar30._0_4_ = (fVar14 - fVar18 * fVar42) * auVar40._0_4_ + fVar42;
        auVar30._4_4_ = (fVar14 - fVar16 * fVar45) * auVar40._4_4_ + fVar45;
        auVar30._8_4_ = (fVar14 - fVar17 * fVar46) * auVar40._8_4_ + fVar46;
        auVar30._12_4_ = (fVar14 - fVar15 * fVar47) * auVar40._12_4_ + fVar47;
        if ((bool)(~(auVar29._4_4_ == iVar31 && auVar20._0_4_ < auVar29._0_4_ ||
                    iVar31 < auVar29._4_4_) & 1)) {
          *(float *)((long)yslope + lVar10) = auVar30._0_4_;
        }
        if ((auVar29._12_4_ != iVar32 || auVar29._8_4_ <= auVar20._8_4_) && auVar29._12_4_ <= iVar32
           ) {
          *(float *)((long)yslope + lVar10 + 4) = auVar30._4_4_;
        }
        auVar29 = auVar21 ^ auVar6;
        in_XMM11._0_4_ = -(uint)(auVar20._0_4_ < auVar29._0_4_);
        in_XMM11._4_4_ = -(uint)(iVar31 < auVar29._4_4_);
        in_XMM11._8_4_ = -(uint)(auVar20._8_4_ < auVar29._8_4_);
        in_XMM11._12_4_ = -(uint)(iVar32 < auVar29._12_4_);
        iVar31 = -(uint)(auVar29._4_4_ == iVar31);
        iVar32 = -(uint)(auVar29._12_4_ == iVar32);
        auVar44._4_4_ = iVar31;
        auVar44._0_4_ = iVar31;
        auVar44._8_4_ = iVar32;
        auVar44._12_4_ = iVar32;
        auVar35._4_4_ = in_XMM11._4_4_;
        auVar35._0_4_ = in_XMM11._4_4_;
        auVar35._8_4_ = in_XMM11._12_4_;
        auVar35._12_4_ = in_XMM11._12_4_;
        auVar36._8_4_ = 0xffffffff;
        auVar36._0_8_ = 0xffffffffffffffff;
        auVar36._12_4_ = 0xffffffff;
        auVar36 = (auVar35 | auVar44 & in_XMM11) ^ auVar36;
        if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          auVar5._4_8_ = in_XMM11._8_8_;
          auVar5._0_4_ = auVar30._4_4_;
          auVar41._0_8_ = auVar5._0_8_ << 0x20;
          auVar41._8_4_ = auVar30._8_4_;
          auVar41._12_4_ = auVar30._12_4_;
          in_XMM11._8_8_ = auVar30._8_8_;
          in_XMM11._0_8_ = auVar41._8_8_;
          *(float *)((long)yslope + lVar10 + 8) = auVar30._8_4_;
        }
        if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(float *)((long)yslope + lVar10 + 0xc) = auVar30._12_4_;
        }
        lVar11 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + 4;
        auVar22._8_8_ = lVar11 + 4;
        lVar11 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + 4;
        auVar21._8_8_ = lVar11 + 4;
        fVar18 = fVar18 + -4.0;
        fVar16 = fVar16 + -4.0;
        fVar17 = fVar17 + -4.0;
        fVar15 = fVar15 + -4.0;
        lVar10 = lVar10 + 0x10;
      } while ((ulong)((int)uVar12 + 3U & 0xfffffffc) << 2 != lVar10);
    }
  }
  return;
}

Assistant:

void R_SetupFreelook()
{
	double dy;
		
	if (camera != NULL)
	{
		dy = FocalLengthY * (-ViewPitch).Tan();
	}
	else
	{
		dy = 0;
	}

	CenterY = (viewheight / 2.0) + dy;
	centery = xs_ToInt(CenterY);
	globaluclip = -CenterY / InvZtoScale;
	globaldclip = (viewheight - CenterY) / InvZtoScale;

	//centeryfrac &= 0xffff0000;
	int e, i;

	i = 0;
	e = viewheight;
	float focus = float(FocalLengthY);
	float den;
	float cy = float(CenterY);
	if (i < centery)
	{
		den = cy - i - 0.5f;
		if (e <= centery)
		{
			do {
				yslope[i] = focus / den;
				den -= 1;
			} while (++i < e);
		}
		else
		{
			do {
				yslope[i] = focus / den;
				den -= 1;
			} while (++i < centery);
			den = i - cy + 0.5f;
			do {
				yslope[i] = focus / den;
				den += 1;
			} while (++i < e);
		}
	}
	else
	{
		den = i - cy + 0.5f;
		do {
			yslope[i] = focus / den;
			den += 1;
		} while (++i < e);
	}
}